

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O3

LinkedToken * __thiscall Cache<LinkedToken>::add(Cache<LinkedToken> *this,LinkedToken *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  __normal_iterator<Cache<LinkedToken>::Entry_*,_std::vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>_>
  __last;
  long lVar4;
  Entry local_78;
  
  __last = std::
           __find_if<__gnu_cxx::__normal_iterator<Cache<LinkedToken>::Entry*,std::vector<Cache<LinkedToken>::Entry,std::allocator<Cache<LinkedToken>::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Cache<LinkedToken>::freeInvalidComments()::_lambda(Cache<LinkedToken>::Entry_const&)_1_>>
                     ((this->entries).
                      super__Vector_base<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->entries).
                      super__Vector_base<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>::_M_erase
            (&this->entries,
             (this->entries).
             super__Vector_base<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start,(iterator)__last._M_current);
  paVar2 = &local_78.data.token.content.field_2;
  local_78.data.token.content._M_dataplus._M_p = (data->token).content._M_dataplus._M_p;
  paVar1 = &(data->token).content.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.data.token.content._M_dataplus._M_p == paVar1) {
    local_78.data.token.content.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.data.token.content.field_2._8_8_ =
         *(undefined8 *)((long)&(data->token).content.field_2 + 8);
    local_78.data.token.content._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_78.data.token.content.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_78.data.token.content._M_string_length = (data->token).content._M_string_length;
  paVar3 = &local_78.data.link.field_2;
  (data->token).content._M_dataplus._M_p = (pointer)paVar1;
  (data->token).content._M_string_length = 0;
  (data->token).content.field_2._M_local_buf[0] = '\0';
  local_78.data.token.type = (data->token).type;
  local_78.data.link._M_dataplus._M_p = (data->link)._M_dataplus._M_p;
  paVar1 = &(data->link).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.data.link._M_dataplus._M_p == paVar1) {
    local_78.data.link.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.data.link.field_2._8_8_ = *(undefined8 *)((long)&(data->link).field_2 + 8);
    local_78.data.link._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_78.data.link.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_78.data.link._M_string_length = (data->link)._M_string_length;
  (data->link)._M_dataplus._M_p = (pointer)paVar1;
  (data->link)._M_string_length = 0;
  (data->link).field_2._M_local_buf[0] = '\0';
  lVar4 = std::chrono::_V2::system_clock::now();
  local_78.expiration.__d.__r = (duration)((this->validityTime).__r * 1000000000 + lVar4);
  std::vector<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>::
  emplace_back<Cache<LinkedToken>::Entry>(&this->entries,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.data.link._M_dataplus._M_p != paVar3) {
    operator_delete(local_78.data.link._M_dataplus._M_p,
                    local_78.data.link.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.data.token.content._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.data.token.content._M_dataplus._M_p,
                    local_78.data.token.content.field_2._M_allocated_capacity + 1);
  }
  return &(this->entries).
          super__Vector_base<Cache<LinkedToken>::Entry,_std::allocator<Cache<LinkedToken>::Entry>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].data;
}

Assistant:

T* add(T data) {
			freeInvalidComments();
			entries.push_back( { std::move(data), Clock::now() + validityTime });
			return &entries.back().data;
		}